

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal.h
# Opt level: O2

Test * __thiscall
testing::internal::
TestFactoryImpl<optTyped_defaultConstructor_Test<mp::opt<long,_mp::opt_null_value_policy<long,_-1L>_>_>_>
::CreateTest(TestFactoryImpl<optTyped_defaultConstructor_Test<mp::opt<long,_mp::opt_null_value_policy<long,__1L>_>_>_>
             *this)

{
  Test *this_00;
  
  this_00 = (Test *)operator_new(0x28);
  optTyped_defaultConstructor_Test<mp::opt<long,_mp::opt_null_value_policy<long,_-1L>_>_>::
  optTyped_defaultConstructor_Test
            ((optTyped_defaultConstructor_Test<mp::opt<long,_mp::opt_null_value_policy<long,__1L>_>_>
              *)this_00);
  return this_00;
}

Assistant:

virtual Test* CreateTest() { return new TestClass; }